

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  ssl_connection_state sVar1;
  connectdata *conn;
  curl_llist_element *pcVar2;
  Curl_handler *pCVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  hostname *phVar7;
  _Bool _Var8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  connectbundle *pcVar12;
  Curl_easy *pCVar13;
  char *pcVar14;
  Curl_easy *handle;
  char *pcVar15;
  curl_llist_element *pcVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  connectdata *local_b0;
  ulong local_88;
  ulong local_80;
  
  uVar10 = IsPipeliningPossible(data,needle);
  if (((data->state).authhost.want & 0x28) == 0) {
    bVar18 = false;
  }
  else {
    bVar18 = (needle->handler->protocol & 3) != 0;
  }
  if (((needle->bits).proxy_user_passwd == true) && (((data->state).authproxy.want & 0x28) != 0)) {
    bVar19 = (needle->handler->protocol & 3) != 0;
  }
  else {
    bVar19 = false;
  }
  *force_reuse = false;
  *waitpipe = false;
  if ((uVar10 & 1) != 0) {
    _Var8 = Curl_pipeline_site_blacklisted(data,needle);
    if (_Var8) {
      uVar10 = uVar10 & 2;
    }
  }
  pcVar12 = Curl_conncache_find_bundle(needle,(data->state).conn_cache);
  if (pcVar12 == (connectbundle *)0x0) {
    bVar9 = false;
    local_b0 = (connectdata *)0x0;
    goto LAB_0060cb09;
  }
  if (pcVar12->multiuse == 2) {
    pcVar14 = "can multiplex";
LAB_0060ca47:
    local_88 = 0;
  }
  else {
    pcVar14 = "serially";
    if (data->multi == (Curl_multi *)0x0) goto LAB_0060ca47;
    local_88 = data->multi->max_pipeline_length;
  }
  phVar7 = &needle->host;
  if ((needle->bits).conn_to_host != false) {
    phVar7 = &needle->conn_to_host;
  }
  pcVar15 = "can pipeline";
  if (pcVar12->multiuse != 1) {
    pcVar15 = pcVar14;
  }
  Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar7->name,pcVar12,pcVar15);
  uVar6 = 0;
  if (uVar10 == 0) {
LAB_0060cbcf:
    pcVar16 = (pcVar12->conn_list).head;
    local_80 = local_88;
    bVar9 = false;
    local_b0 = (connectdata *)0x0;
    do {
      bVar4 = true;
      if (pcVar16 == (curl_llist_element *)0x0) break;
      conn = (connectdata *)pcVar16->ptr;
      pcVar16 = pcVar16->next;
      _Var8 = disconnect_if_dead(conn,data);
      if (_Var8) {
LAB_0060cc5c:
        bVar5 = false;
        conn = local_b0;
      }
      else {
        uVar17 = (conn->recv_pipe).size + (conn->send_pipe).size;
        if (uVar6 == 0) {
          if (uVar17 == 0) {
            if ((conn->sock[0] != -1) && ((conn->bits).close != true)) goto LAB_0060cd35;
            if ((conn->bits).close == false) {
              bVar9 = true;
            }
            uVar17 = conn->connection_id;
            pcVar14 = "Connection #%ld isn\'t open enough, can\'t reuse\n";
LAB_0060ccf7:
            bVar5 = false;
            Curl_infof(data,pcVar14,uVar17);
            conn = local_b0;
            goto LAB_0060cc5f;
          }
          goto LAB_0060cc5c;
        }
        if (((conn->bits).protoconnstart == true) && ((conn->bits).close != false))
        goto LAB_0060cc5c;
        if ((conn->bits).multiplex == false) {
          pcVar2 = (conn->send_pipe).head;
          if (pcVar2 == (curl_llist_element *)0x0) {
            handle = (Curl_easy *)0x0;
          }
          else {
            handle = (Curl_easy *)pcVar2->ptr;
          }
          pcVar2 = (conn->recv_pipe).head;
          if (pcVar2 == (curl_llist_element *)0x0) {
            pCVar13 = (Curl_easy *)0x0;
          }
          else {
            pCVar13 = (Curl_easy *)pcVar2->ptr;
          }
          if (((handle != (Curl_easy *)0x0) || (handle = pCVar13, pCVar13 != (Curl_easy *)0x0)) &&
             (uVar10 = IsPipeliningPossible(handle,conn), (uVar10 & 1) == 0)) goto LAB_0060cc5c;
        }
LAB_0060cd35:
        pCVar3 = needle->handler;
        if (((((((conn->handler->flags ^ pCVar3->flags) & 1) != 0) &&
              ((uVar10 = get_protocol_family(conn->handler->protocol), uVar10 != pCVar3->protocol ||
               (conn->tls_upgraded != true)))) ||
             ((needle->bits).httpproxy != (conn->bits).httpproxy)) ||
            ((_Var8 = (needle->bits).socksproxy, _Var8 != (conn->bits).socksproxy ||
             ((_Var8 != false &&
              (_Var8 = proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy), !_Var8)))))) ||
           (((needle->bits).conn_to_host != (conn->bits).conn_to_host ||
            ((needle->bits).conn_to_port != (conn->bits).conn_to_port)))) goto LAB_0060cc5c;
        if ((needle->bits).httpproxy == true) {
          _Var8 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy);
          if ((_Var8) && ((needle->bits).tunnel_proxy == (conn->bits).tunnel_proxy)) {
            if ((needle->http_proxy).proxytype != CURLPROXY_HTTPS) goto LAB_0060ce84;
            if ((needle->handler->flags & 1) == 0) {
              _Var8 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
              if (_Var8) {
                sVar1 = conn->ssl[0].state;
joined_r0x0060ce7e:
                if (sVar1 == ssl_connection_complete) goto LAB_0060ce84;
              }
            }
            else {
              _Var8 = Curl_ssl_config_matches(&needle->proxy_ssl_config,&conn->proxy_ssl_config);
              if (_Var8) {
                sVar1 = conn->proxy_ssl[0].state;
                goto joined_r0x0060ce7e;
              }
            }
          }
          goto LAB_0060cc5c;
        }
LAB_0060ce84:
        if (((uVar6 == 0) && (conn->inuse != false)) ||
           (((pcVar14 = needle->localdev, pcVar14 != (char *)0x0 || (needle->localport != 0)) &&
            (((conn->localport != needle->localport ||
              (conn->localportrange != needle->localportrange)) ||
             ((pcVar14 != (char *)0x0 &&
              ((conn->localdev == (char *)0x0 ||
               (iVar11 = strcmp(conn->localdev,pcVar14), iVar11 != 0)))))))))) goto LAB_0060cc5c;
        pCVar3 = needle->handler;
        uVar10 = pCVar3->flags;
        if ((-1 < (char)uVar10) &&
           ((iVar11 = strcmp(needle->user,conn->user), iVar11 != 0 ||
            (iVar11 = strcmp(needle->passwd,conn->passwd), iVar11 != 0)))) goto LAB_0060cc5c;
        if (((uVar10 & 1) != 0) ||
           (((needle->bits).httpproxy == false || ((needle->bits).tunnel_proxy == true)))) {
          iVar11 = Curl_strcasecompare(pCVar3->scheme,conn->handler->scheme);
          if ((((iVar11 != 0) ||
               ((uVar10 = get_protocol_family(conn->handler->protocol),
                uVar10 == needle->handler->protocol && (conn->tls_upgraded == true)))) &&
              (((needle->bits).conn_to_host != true ||
               (iVar11 = Curl_strcasecompare((needle->conn_to_host).name,(conn->conn_to_host).name),
               iVar11 != 0)))) &&
             (((((needle->bits).conn_to_port != true || (needle->conn_to_port == conn->conn_to_port)
                ) && (iVar11 = Curl_strcasecompare((needle->host).name,(conn->host).name),
                     iVar11 != 0)) && (needle->remote_port == conn->remote_port)))) {
            if ((needle->handler->flags & 1) == 0) goto LAB_0060d00f;
            _Var8 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
            if (_Var8) {
              if (conn->ssl[0].state == ssl_connection_complete) goto LAB_0060d00f;
              bVar9 = true;
            }
          }
          goto LAB_0060cc5c;
        }
LAB_0060d00f:
        if (!bVar18) {
          if ((conn->ntlm).state == NTLMSTATE_NONE) goto LAB_0060d08c;
          goto LAB_0060cc5c;
        }
        iVar11 = strcmp(needle->user,conn->user);
        if ((iVar11 != 0) || (iVar11 = strcmp(needle->passwd,conn->passwd), iVar11 != 0))
        goto LAB_0060cc5c;
LAB_0060d08c:
        if (!bVar19) {
          if ((conn->proxyntlm).state == NTLMSTATE_NONE) goto LAB_0060d12d;
          goto LAB_0060cc5c;
        }
        pcVar14 = (conn->http_proxy).user;
        if (((pcVar14 == (char *)0x0) ||
            (pcVar15 = (conn->http_proxy).passwd, pcVar15 == (char *)0x0)) ||
           ((iVar11 = strcmp((needle->http_proxy).user,pcVar14), iVar11 != 0 ||
            (iVar11 = strcmp((needle->http_proxy).passwd,pcVar15), iVar11 != 0))))
        goto LAB_0060cc5c;
LAB_0060d12d:
        if (bVar18 || bVar19) {
          if (((bVar18) && ((conn->ntlm).state != NTLMSTATE_NONE)) ||
             ((bVar19 && ((conn->proxyntlm).state != NTLMSTATE_NONE)))) {
            *force_reuse = true;
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        }
        else {
          bVar5 = true;
          if ((uVar6 != 0) && (uVar17 != 0)) {
            if (local_88 - 1 < uVar17) {
              pcVar14 = "Pipe is full, skip (%zu)\n";
              goto LAB_0060ccf7;
            }
            _Var8 = Curl_pipeline_penalized(data,conn);
            if (_Var8) {
              bVar5 = false;
              Curl_infof(data,"Penalized, skip\n");
              conn = local_b0;
            }
            else if (local_88 == 0) {
              Curl_infof(data,"Multiplexed connection found!\n");
            }
            else {
              if (local_80 <= uVar17) goto LAB_0060cc5c;
              bVar5 = false;
              local_80 = uVar17;
            }
          }
        }
      }
LAB_0060cc5f:
      local_b0 = conn;
    } while (!bVar5);
  }
  else {
    if (0 < pcVar12->multiuse) {
LAB_0060cb66:
      if ((pcVar12->multiuse != 1) || (_Var8 = Curl_pipeline_wanted(data->multi,1), _Var8)) {
        uVar6 = uVar10;
        if ((pcVar12->multiuse != 2) || (_Var8 = Curl_pipeline_wanted(data->multi,2), _Var8))
        goto LAB_0060cbcf;
        pcVar14 = "Could multiplex, but not asked to!\n";
      }
      else {
        pcVar14 = "Could pipeline, but not asked to!\n";
      }
      Curl_infof(data,pcVar14);
      uVar6 = 0;
      goto LAB_0060cbcf;
    }
    if ((pcVar12->multiuse != 0) || ((data->set).pipewait != true)) {
      uVar10 = 0;
      Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
      goto LAB_0060cb66;
    }
    bVar4 = false;
    Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
    *waitpipe = true;
    bVar9 = false;
    local_b0 = (connectdata *)0x0;
  }
  if (!bVar4) {
    return false;
  }
LAB_0060cb09:
  if (local_b0 != (connectdata *)0x0) {
    *usethis = local_b0;
    return true;
  }
  if ((bVar9) && ((data->set).pipewait == true)) {
    Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
    *waitpipe = true;
    return false;
  }
  return false;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  int canpipe = IsPipeliningPossible(data, needle);
  struct connectbundle *bundle;

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                      (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                      (needle->handler->protocol & PROTO_FAMILY_HTTP));
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                           ((data->state.authproxy.want &
                           (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                           (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* We can't pipeline if the site is blacklisted */
  if((canpipe & CURLPIPE_HTTP1) &&
     Curl_pipeline_site_blacklisted(data, needle))
    canpipe &= ~ CURLPIPE_HTTP1;

  /* Look up the bundle with all the connections to this
     particular host */
  bundle = Curl_conncache_find_bundle(needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    size_t max_pipe_len = (bundle->multiuse != BUNDLE_MULTIPLEX)?
      max_pipeline_length(data->multi):0;
    size_t best_pipe_len = max_pipe_len;
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p [%s]\n",
          (needle->bits.conn_to_host ? needle->conn_to_host.name :
           needle->host.name), (void *)bundle,
          (bundle->multiuse == BUNDLE_PIPELINING ?
           "can pipeline" :
           (bundle->multiuse == BUNDLE_MULTIPLEX ?
            "can multiplex" : "serially")));

    /* We can't pipeline if we don't know anything about the server */
    if(canpipe) {
      if(bundle->multiuse <= BUNDLE_UNKNOWN) {
        if((bundle->multiuse == BUNDLE_UNKNOWN) && data->set.pipewait) {
          infof(data, "Server doesn't support multi-use yet, wait\n");
          *waitpipe = TRUE;
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multi-use (yet)\n");
        canpipe = 0;
      }
      if((bundle->multiuse == BUNDLE_PIPELINING) &&
         !Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1)) {
        /* not asked for, switch off */
        infof(data, "Could pipeline, but not asked to!\n");
        canpipe = 0;
      }
      else if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
              !Curl_pipeline_wanted(data->multi, CURLPIPE_MULTIPLEX)) {
        infof(data, "Could multiplex, but not asked to!\n");
        canpipe = 0;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t pipeLen;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(disconnect_if_dead(check, data))
        continue;

      pipeLen = check->send_pipe.size + check->recv_pipe.size;

      if(canpipe) {
        if(check->bits.protoconnstart && check->bits.close)
          continue;

        if(!check->bits.multiplex) {
          /* If not multiplexing, make sure the connection is fine for HTTP/1
             pipelining */
          struct Curl_easy* sh = gethandleathead(&check->send_pipe);
          struct Curl_easy* rh = gethandleathead(&check->recv_pipe);
          if(sh) {
            if(!(IsPipeliningPossible(sh, check) & CURLPIPE_HTTP1))
              continue;
          }
          else if(rh) {
            if(!(IsPipeliningPossible(rh, check) & CURLPIPE_HTTP1))
              continue;
          }
        }
      }
      else {
        if(pipeLen > 0) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          if(!check->bits.close)
            foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
#ifdef DEBUGBUILD
          if(check->recv_pipe.size > 0) {
            infof(data,
                  "BAD! Unconnected #%ld has a non-empty recv pipeline!\n",
                  check->connection_id);
          }
#endif
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->abstract_unix_socket != check->abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler->protocol) !=
           needle->handler->protocol || !check->tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy && !proxy_info_matches(&needle->socks_proxy,
                                                        &check->socks_proxy))
        continue;

      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
          else {
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config))
              continue;
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
        }
      }

      if(!canpipe && check->inuse)
        /* this request can't be pipelined but the checked connection is
           already in use so we skip it */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(strcmp(needle->user, check->user) ||
           strcmp(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
      }

      if(!needle->bits.httpproxy || (needle->handler->flags&PROTOPT_SSL) ||
         needle->bits.tunnel_proxy) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler->protocol) ==
             needle->handler->protocol && check->tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(strcmp(needle->user, check->user) ||
             strcmp(needle->passwd, check->passwd))
            continue;
        }
        else if(check->ntlm.state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(strcmp(needle->http_proxy.user, check->http_proxy.user) ||
             strcmp(needle->http_proxy.passwd, check->http_proxy.passwd))
            continue;
        }
        else if(check->proxyntlm.state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->ntlm.state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxyntlm.state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canpipe) {
          /* We can pipeline if we want to. Let's continue looking for
             the optimal connection to use, i.e the shortest pipe that is not
             blacklisted. */

          if(pipeLen == 0) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

          /* We can't use the connection if the pipe is full */
          if(max_pipe_len && (pipeLen >= max_pipe_len)) {
            infof(data, "Pipe is full, skip (%zu)\n", pipeLen);
            continue;
          }
#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(pipeLen >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)\n",
                    pipeLen);
              continue;
            }
          }
#endif
          /* We can't use the connection if the pipe is penalized */
          if(Curl_pipeline_penalized(data, check)) {
            infof(data, "Penalized, skip\n");
            continue;
          }

          if(max_pipe_len) {
            if(pipeLen < best_pipe_len) {
              /* This connection has a shorter pipe so far. We'll pick this
                 and continue searching */
              chosen = check;
              best_pipe_len = pipeLen;
              continue;
            }
          }
          else {
            /* When not pipelining (== multiplexed), we have a match here! */
            chosen = check;
            infof(data, "Multiplexed connection found!\n");
            break;
          }
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}